

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3PagerSavepoint(Pager *pPager,int op,int iSavepoint)

{
  i64 *pOffset;
  uint uVar1;
  Pgno PVar2;
  u32 uVar3;
  sqlite3_io_methods *psVar4;
  u32 *puVar5;
  Wal *pWVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  u32 uVar11;
  u32 uVar12;
  Bitvec *pDone;
  PgHdr *pPVar13;
  Pgno *pPVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  PagerSavepoint *pPVar20;
  int iVar21;
  u32 nJRec;
  u32 dummy;
  ulong local_48;
  PagerSavepoint *local_40;
  u32 local_34;
  
  iVar15 = pPager->errCode;
  if (pPager->errCode == 0) {
    iVar15 = 0;
    if (iSavepoint < pPager->nSavepoint) {
      iVar21 = (uint)(op != 1) + iSavepoint;
      if (iVar21 < pPager->nSavepoint) {
        lVar16 = (ulong)(op != 1) + (long)iSavepoint;
        lVar18 = lVar16 * 0x38 + 0x10;
        do {
          sqlite3BitvecDestroy(*(Bitvec **)((long)pPager->aSavepoint->aWalData + lVar18 + -0x24));
          lVar16 = lVar16 + 1;
          lVar18 = lVar18 + 0x38;
        } while (lVar16 < pPager->nSavepoint);
      }
      pPager->nSavepoint = iVar21;
      if (op == 1) {
        pPVar20 = pPager->aSavepoint;
        iVar15 = 0;
        if (pPVar20[iVar21].bTruncateOnRelease != 0) {
          psVar4 = pPager->sjfd->pMethods;
          if (psVar4 != (sqlite3_io_methods *)0x0) {
            iVar15 = 0;
            if (psVar4 == &MemJournalMethods) {
              iVar15 = memjrnlTruncate(pPager->sjfd,
                                       (ulong)pPVar20[iVar21].iSubRec * (pPager->pageSize + 4));
            }
            pPager->nSubRec = pPVar20[iVar21].iSubRec;
          }
        }
      }
      else if ((pPager->pWal != (Wal *)0x0) || (pPager->jfd->pMethods != (sqlite3_io_methods *)0x0))
      {
        if (iVar21 == 0) {
          pPVar20 = (PagerSavepoint *)0x0;
        }
        else {
          pPVar20 = pPager->aSavepoint + (long)iVar21 + -1;
        }
        if (pPVar20 == (PagerSavepoint *)0x0) {
          pDone = (Bitvec *)0x0;
        }
        else {
          PVar2 = pPVar20->nOrig;
          pDone = (Bitvec *)sqlite3Malloc(0x200);
          if (pDone == (Bitvec *)0x0) {
            return 7;
          }
          memset(pDone,0,0x200);
          pDone->iSize = PVar2;
        }
        pPVar14 = &pPVar20->nOrig;
        if (pPVar20 == (PagerSavepoint *)0x0) {
          pPVar14 = &pPager->dbOrigSize;
        }
        pPager->dbSize = *pPVar14;
        pPager->changeCountDone = pPager->tempFile;
        if ((pPVar20 == (PagerSavepoint *)0x0) && (pWVar6 = pPager->pWal, pWVar6 != (Wal *)0x0)) {
          pPager->dbSize = pPager->dbOrigSize;
          if (pWVar6->writeLock == '\0') {
            iVar15 = 0;
          }
          else {
            uVar17 = (pWVar6->hdr).mxFrame;
            puVar5 = *pWVar6->apWiData;
            uVar11 = puVar5[0];
            uVar12 = puVar5[1];
            uVar7 = *(undefined8 *)(puVar5 + 2);
            uVar3 = puVar5[5];
            uVar8 = *(undefined8 *)(puVar5 + 6);
            uVar9 = *(undefined8 *)(puVar5 + 8);
            uVar10 = *(undefined8 *)(puVar5 + 10);
            (pWVar6->hdr).mxFrame = puVar5[4];
            (pWVar6->hdr).nPage = uVar3;
            *(undefined8 *)(pWVar6->hdr).aFrameCksum = uVar8;
            (pWVar6->hdr).iVersion = uVar11;
            (pWVar6->hdr).unused = uVar12;
            (pWVar6->hdr).iChange = (int)uVar7;
            (pWVar6->hdr).isInit = (char)((ulong)uVar7 >> 0x20);
            (pWVar6->hdr).bigEndCksum = (char)((ulong)uVar7 >> 0x28);
            (pWVar6->hdr).szPage = (short)((ulong)uVar7 >> 0x30);
            *(undefined8 *)(pWVar6->hdr).aSalt = uVar9;
            *(undefined8 *)(pWVar6->hdr).aCksum = uVar10;
            uVar3 = (pWVar6->hdr).mxFrame;
            iVar15 = 0;
            if (uVar3 + 1 <= uVar17) {
              uVar19 = uVar3 + 0x1001;
              do {
                if (((ulong)uVar19 + 0xffffffff021 & 0xffffffff000) == 0) {
                  pPVar14 = *pWVar6->apWiData + (ulong)(uVar19 - 0x1000) + 0x21;
                }
                else {
                  pPVar14 = (Pgno *)((ulong)((uVar19 - 0xfdf & 0xfff) << 2) +
                                    (long)pWVar6->apWiData
                                          [(int)((ulong)uVar19 + 0xffffffff021 >> 0xc)]);
                }
                iVar15 = pagerUndoCallback(pPager,*pPVar14);
              } while ((iVar15 == 0) &&
                      (uVar1 = uVar19 - 0xfff, uVar19 = uVar19 + 1, uVar1 <= uVar17));
            }
            if (uVar17 != (pWVar6->hdr).mxFrame) {
              walCleanupHash(pWVar6);
            }
          }
          pPVar13 = sqlite3PcacheDirtyList(pPager->pPCache);
          if (iVar15 == 0 && pPVar13 != (PgHdr *)0x0) {
            do {
              pPVar14 = &pPVar13->pgno;
              pPVar13 = pPVar13->pDirty;
              iVar15 = pagerUndoCallback(pPager,*pPVar14);
              if (pPVar13 == (PgHdr *)0x0) {
                return iVar15;
              }
            } while (iVar15 == 0);
          }
        }
        else {
          pOffset = &pPager->journalOff;
          lVar16 = pPager->journalOff;
          local_40 = pPVar20;
          if ((pPVar20 == (PagerSavepoint *)0x0) || (pPager->pWal != (Wal *)0x0)) {
            *pOffset = 0;
            iVar15 = 0;
          }
          else {
            lVar18 = pPVar20->iHdrOffset;
            if (pPVar20->iHdrOffset == 0) {
              lVar18 = lVar16;
            }
            *pOffset = pPVar20->iOffset;
            do {
              if (lVar18 <= *pOffset) {
                iVar15 = 0;
                break;
              }
              iVar15 = pager_playback_one_page(pPager,pOffset,pDone,1,1);
            } while (iVar15 == 0);
          }
          if (iVar15 == 0) {
            lVar18 = pPager->journalOff;
            while (lVar18 < lVar16) {
              local_48 = local_48 & 0xffffffff00000000;
              iVar15 = readJournalHdr(pPager,0,lVar16,(u32 *)&local_48,&local_34);
              if (((uint)local_48 == 0) &&
                 ((ulong)pPager->sectorSize + pPager->journalHdr == pPager->journalOff)) {
                local_48 = CONCAT44(local_48._4_4_,
                                    (int)((lVar16 - pPager->journalOff) / (pPager->pageSize + 8)));
              }
              uVar17 = (uint)local_48;
              if (((uint)local_48 != 0 && iVar15 == 0) && (*pOffset < lVar16)) {
                uVar19 = 1;
                do {
                  iVar15 = pager_playback_one_page(pPager,pOffset,pDone,1,1);
                  if ((iVar15 != 0) || (uVar17 <= uVar19)) break;
                  uVar19 = uVar19 + 1;
                } while (*pOffset < lVar16);
              }
              if (iVar15 != 0) break;
              lVar18 = *pOffset;
            }
          }
          pPVar20 = local_40;
          if (local_40 != (PagerSavepoint *)0x0) {
            local_48 = (pPager->pageSize + 4) * (ulong)local_40->iSubRec;
            pWVar6 = pPager->pWal;
            if (pWVar6 != (Wal *)0x0) {
              if (local_40->aWalData[3] != pWVar6->nCkpt) {
                local_40->aWalData[0] = 0;
                local_40->aWalData[3] = pWVar6->nCkpt;
              }
              iVar15 = 0;
              if (local_40->aWalData[0] < (pWVar6->hdr).mxFrame) {
                (pWVar6->hdr).mxFrame = local_40->aWalData[0];
                (pWVar6->hdr).aFrameCksum[0] = local_40->aWalData[1];
                (pWVar6->hdr).aFrameCksum[1] = local_40->aWalData[2];
                walCleanupHash(pWVar6);
              }
            }
            if ((iVar15 == 0) && (uVar17 = pPVar20->iSubRec, uVar17 < pPager->nSubRec)) {
              do {
                iVar15 = pager_playback_one_page(pPager,(i64 *)&local_48,pDone,0,1);
                if (iVar15 != 0) break;
                uVar17 = uVar17 + 1;
              } while (uVar17 < pPager->nSubRec);
            }
          }
          sqlite3BitvecDestroy(pDone);
          if (iVar15 == 0) {
            *pOffset = lVar16;
          }
        }
      }
    }
  }
  return iVar15;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSavepoint(Pager *pPager, int op, int iSavepoint){
  int rc = pPager->errCode;

#ifdef SQLITE_ENABLE_ZIPVFS
  if( op==SAVEPOINT_RELEASE ) rc = SQLITE_OK;
#endif

  assert( op==SAVEPOINT_RELEASE || op==SAVEPOINT_ROLLBACK );
  assert( iSavepoint>=0 || op==SAVEPOINT_ROLLBACK );

  if( rc==SQLITE_OK && iSavepoint<pPager->nSavepoint ){
    int ii;            /* Iterator variable */
    int nNew;          /* Number of remaining savepoints after this op. */

    /* Figure out how many savepoints will still be active after this
    ** operation. Store this value in nNew. Then free resources associated
    ** with any savepoints that are destroyed by this operation.
    */
    nNew = iSavepoint + (( op==SAVEPOINT_RELEASE ) ? 0 : 1);
    for(ii=nNew; ii<pPager->nSavepoint; ii++){
      sqlite3BitvecDestroy(pPager->aSavepoint[ii].pInSavepoint);
    }
    pPager->nSavepoint = nNew;

    /* Truncate the sub-journal so that it only includes the parts
    ** that are still in use. */
    if( op==SAVEPOINT_RELEASE ){
      PagerSavepoint *pRel = &pPager->aSavepoint[nNew];
      if( pRel->bTruncateOnRelease && isOpen(pPager->sjfd) ){
        /* Only truncate if it is an in-memory sub-journal. */
        if( sqlite3JournalIsInMemory(pPager->sjfd) ){
          i64 sz = (pPager->pageSize+4)*(i64)pRel->iSubRec;
          rc = sqlite3OsTruncate(pPager->sjfd, sz);
          assert( rc==SQLITE_OK );
        }
        pPager->nSubRec = pRel->iSubRec;
      }
    }
    /* Else this is a rollback operation, playback the specified savepoint.
    ** If this is a temp-file, it is possible that the journal file has
    ** not yet been opened. In this case there have been no changes to
    ** the database file, so the playback operation can be skipped.
    */
    else if( pagerUseWal(pPager) || isOpen(pPager->jfd) ){
      PagerSavepoint *pSavepoint = (nNew==0)?0:&pPager->aSavepoint[nNew-1];
      rc = pagerPlaybackSavepoint(pPager, pSavepoint);
      assert(rc!=SQLITE_DONE);
    }

#ifdef SQLITE_ENABLE_ZIPVFS
    /* If the cache has been modified but the savepoint cannot be rolled
    ** back journal_mode=off, put the pager in the error state. This way,
    ** if the VFS used by this pager includes ZipVFS, the entire transaction
    ** can be rolled back at the ZipVFS level.  */
    else if(
        pPager->journalMode==PAGER_JOURNALMODE_OFF
     && pPager->eState>=PAGER_WRITER_CACHEMOD
    ){
      pPager->errCode = SQLITE_ABORT;
      pPager->eState = PAGER_ERROR;
      setGetterMethod(pPager);
    }
#endif
  }

  return rc;
}